

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffered_stream.c
# Opt level: O0

void handle_partial_writes
               (cio_buffered_stream *buffered_stream,cio_io_stream *io_stream,
               cio_write_buffer *buffer,size_t bytes_transferred)

{
  _Bool _Var1;
  cio_error cVar2;
  cio_error err;
  size_t new_length;
  void *new_data;
  size_t bytes_transferred_local;
  cio_write_buffer *buffer_local;
  cio_io_stream *io_stream_local;
  cio_buffered_stream *buffered_stream_local;
  
  cio_write_buffer_head_init(&buffered_stream->wbh);
  buffered_stream->original_wbh = buffer;
  bytes_transferred_local = (size_t)buffer->next;
  new_data = (void *)bytes_transferred;
  while( true ) {
    _Var1 = buffer_partially_written((cio_write_buffer *)bytes_transferred_local,(size_t)new_data);
    if (((_Var1 ^ 0xffU) & 1) == 0) break;
    new_data = (void *)((long)new_data - *(long *)(bytes_transferred_local + 0x18));
    bytes_transferred_local = *(size_t *)bytes_transferred_local;
  }
  cio_write_buffer_const_element_init
            (&buffered_stream->write_buffer,
             (void *)(*(long *)(bytes_transferred_local + 0x10) + (long)new_data),
             *(long *)(bytes_transferred_local + 0x18) - (long)new_data);
  cio_write_buffer_queue_head(&buffered_stream->wbh,&buffered_stream->write_buffer);
  cio_write_buffer_split_and_append
            (&buffered_stream->wbh,buffered_stream->original_wbh,
             *(cio_write_buffer **)bytes_transferred_local);
  cVar2 = (*buffered_stream->stream->write_some)
                    (io_stream,&buffered_stream->wbh,handle_write,buffered_stream);
  if (cVar2 != CIO_SUCCESS) {
    (*buffered_stream->write_handler)(buffered_stream,buffered_stream->write_handler_context,cVar2);
  }
  return;
}

Assistant:

static void handle_partial_writes(struct cio_buffered_stream *buffered_stream, struct cio_io_stream *io_stream, struct cio_write_buffer *buffer, size_t bytes_transferred)
{
	cio_write_buffer_head_init(&buffered_stream->wbh);
	buffered_stream->original_wbh = buffer;

	buffer = buffer->next;
	while (!buffer_partially_written(buffer, bytes_transferred)) {
		bytes_transferred -= buffer->data.element.length;
		buffer = buffer->next;
	}

	const void *new_data = &((const uint8_t *)buffer->data.element.const_data)[bytes_transferred];
	size_t new_length = buffer->data.element.length - bytes_transferred;
	cio_write_buffer_const_element_init(&buffered_stream->write_buffer, new_data, new_length);
	cio_write_buffer_queue_head(&buffered_stream->wbh, &buffered_stream->write_buffer);

	cio_write_buffer_split_and_append(&buffered_stream->wbh, buffered_stream->original_wbh, buffer->next);

	enum cio_error err = buffered_stream->stream->write_some(io_stream, &buffered_stream->wbh, handle_write, buffered_stream);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		buffered_stream->write_handler(buffered_stream, buffered_stream->write_handler_context, err);
	}
}